

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O0

void func_call_by_pointer(size_t COUNT)

{
  char *pcVar1;
  ostream *poVar2;
  rep_conflict rVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double Mrps;
  double ns_per_op;
  duration<double,_std::ratio<1L,_1L>_> local_40;
  duration<double,_std::ratio<1L,_1L>_> diff;
  now_t stop;
  undefined8 uStack_28;
  uint32_t i;
  size_t res;
  now_t start;
  f_t f;
  size_t COUNT_local;
  undefined4 uVar7;
  
  start.__d.__r = (duration)f1;
  res = (size_t)now();
  uStack_28 = 0;
  for (stop.__d.__r._4_4_ = 0; stop.__d.__r._4_4_ < COUNT;
      stop.__d.__r._4_4_ = stop.__d.__r._4_4_ + 1) {
    start.__d.__r = (duration)(*(code *)start.__d.__r)(&stack0xffffffffffffffd8);
  }
  diff.__r = (rep_conflict)now();
  side_effect = side_effect + ((uint)uStack_28 & 1);
  ns_per_op = (double)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&diff,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                           *)&res);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_40,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&ns_per_op);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_40);
  uVar7 = (undefined4)(COUNT >> 0x20);
  auVar6._8_4_ = uVar7;
  auVar6._0_8_ = COUNT;
  auVar6._12_4_ = 0x45300000;
  dVar4 = (rVar3 * 1000.0 * 1000.0 * 1000.0) /
          ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)COUNT) - 4503599627370496.0));
  auVar5._8_4_ = uVar7;
  auVar5._0_8_ = COUNT;
  auVar5._12_4_ = 0x45300000;
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_40);
  pcVar1 = expand_name("func_call_by_pointer");
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,": ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  poVar2 = std::operator<<(poVar2,"ns per operation,\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4 / unit);
  poVar2 = std::operator<<(poVar2," ticks,\t");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((((auVar5._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)COUNT) - 4503599627370496.0)) /
                              rVar3) / 1000.0) / 1000.0);
  poVar2 = std::operator<<(poVar2," Mrps");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void __attribute__((noinline))
func_call_by_pointer(const size_t COUNT = 0x10000000)
{
    f_t f = (f_t)f1;
    now_t start = now();
    size_t res = 0;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        f = (f_t)f(res);
    }
    now_t stop = now();
    side_effect += res % 2;

    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}